

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_parser.c
# Opt level: O0

uchar * yajl_render_error_string(yajl_handle hand,uchar *jsonText,size_t jsonTextLen,int verbose)

{
  code *pcVar1;
  undefined8 uVar2;
  yajl_lex_error error;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  uchar *__dest;
  int in_ECX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  char *newStr;
  size_t spacesNeeded;
  size_t i;
  size_t end;
  size_t start;
  size_t memneeded;
  char *arrow;
  char text [72];
  char *errorText;
  char *errorType;
  uchar *str;
  size_t offset;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_c0;
  ulong local_b0;
  long local_a8;
  char local_98 [80];
  char *local_48;
  char *local_40;
  uchar *local_38;
  ulong local_30;
  int local_24;
  ulong local_20;
  long local_18;
  long local_10;
  uchar *local_8;
  
  local_30 = *(ulong *)(in_RDI + 0x20);
  local_48 = (char *)0x0;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (*(char *)(*(long *)(in_RDI + 0x30) + *(long *)(in_RDI + 0x40) + -1) == '\x02') {
    local_40 = "parse";
    local_48 = *(char **)(in_RDI + 0x18);
  }
  else if (*(char *)(*(long *)(in_RDI + 0x30) + *(long *)(in_RDI + 0x40) + -1) == '\x03') {
    local_40 = "lexical";
    error = yajl_lex_get_error(*(yajl_lexer *)(in_RDI + 0x10));
    local_48 = yajl_lex_error_to_string(error);
  }
  else {
    local_40 = "unknown";
  }
  sVar3 = strlen(local_40);
  local_a8 = sVar3 + 6;
  if (local_48 != (char *)0x0) {
    sVar4 = strlen(local_48);
    local_a8 = sVar4 + sVar3 + 8;
  }
  local_38 = (uchar *)(**(code **)(local_10 + 0x50))(*(undefined8 *)(local_10 + 0x68),local_a8 + 2);
  if (local_38 == (uchar *)0x0) {
    local_8 = (uchar *)0x0;
  }
  else {
    *local_38 = '\0';
    strcat((char *)local_38,local_40);
    strcat((char *)local_38," error");
    if (local_48 != (char *)0x0) {
      strcat((char *)local_38,": ");
      strcat((char *)local_38,local_48);
    }
    strcat((char *)local_38,"\n");
    if (local_24 != 0) {
      if (local_30 < 0x1e) {
        local_d8 = 0x28 - local_30;
        local_e0 = 0;
      }
      else {
        local_d8 = 10;
        local_e0 = local_30 - 0x1e;
      }
      local_b0 = local_e0;
      if (local_20 < local_30 + 0x1e) {
        local_e8 = local_20;
      }
      else {
        local_e8 = local_30 + 0x1e;
      }
      for (local_c0 = 0; local_c0 < local_d8; local_c0 = local_c0 + 1) {
        local_98[local_c0] = ' ';
      }
      for (; local_b0 < local_e8; local_b0 = local_b0 + 1) {
        if ((*(char *)(local_18 + local_b0) == '\n') || (*(char *)(local_18 + local_b0) == '\r')) {
          local_98[local_c0] = ' ';
        }
        else {
          local_98[local_c0] = *(char *)(local_18 + local_b0);
        }
        local_c0 = local_c0 + 1;
      }
      local_98[local_c0] = '\n';
      local_98[local_c0 + 1] = '\0';
      pcVar1 = *(code **)(local_10 + 0x50);
      uVar2 = *(undefined8 *)(local_10 + 0x68);
      sVar3 = strlen((char *)local_38);
      sVar4 = strlen(local_98);
      sVar5 = strlen("                     (right here) ------^\n");
      __dest = (uchar *)(*pcVar1)(uVar2,(int)sVar3 + (int)sVar4 + (int)sVar5 + 1);
      if (__dest != (uchar *)0x0) {
        *__dest = '\0';
        strcat((char *)__dest,(char *)local_38);
        strcat((char *)__dest,local_98);
        strcat((char *)__dest,"                     (right here) ------^\n");
      }
      (**(code **)(local_10 + 0x60))(*(undefined8 *)(local_10 + 0x68),local_38);
      local_38 = __dest;
    }
    local_8 = local_38;
  }
  return local_8;
}

Assistant:

unsigned char *
yajl_render_error_string(yajl_handle hand, const unsigned char * jsonText,
                         size_t jsonTextLen, int verbose)
{
    size_t offset = hand->bytesConsumed;
    unsigned char * str;
    const char * errorType = NULL;
    const char * errorText = NULL;
    char text[72];
    const char * arrow = "                     (right here) ------^\n";

    if (yajl_bs_current(hand->stateStack) == yajl_state_parse_error) {
        errorType = "parse";
        errorText = hand->parseError;
    } else if (yajl_bs_current(hand->stateStack) == yajl_state_lexical_error) {
        errorType = "lexical";
        errorText = yajl_lex_error_to_string(yajl_lex_get_error(hand->lexer));
    } else {
        errorType = "unknown";
    }

    {
        size_t memneeded = 0;
        memneeded += strlen(errorType);
        memneeded += strlen(" error");
        if (errorText != NULL) {
            memneeded += strlen(": ");
            memneeded += strlen(errorText);
        }
        str = (unsigned char *) YA_MALLOC(&(hand->alloc), memneeded + 2);
        if (!str) return NULL;
        str[0] = 0;
        strcat((char *) str, errorType);
        strcat((char *) str, " error");
        if (errorText != NULL) {
            strcat((char *) str, ": ");
            strcat((char *) str, errorText);
        }
        strcat((char *) str, "\n");
    }

    /* now we append as many spaces as needed to make sure the error
     * falls at char 41, if verbose was specified */
    if (verbose) {
        size_t start, end, i;
        size_t spacesNeeded;

        spacesNeeded = (offset < 30 ? 40 - offset : 10);
        start = (offset >= 30 ? offset - 30 : 0);
        end = (offset + 30 > jsonTextLen ? jsonTextLen : offset + 30);

        for (i=0;i<spacesNeeded;i++) text[i] = ' ';

        for (;start < end;start++, i++) {
            if (jsonText[start] != '\n' && jsonText[start] != '\r')
            {
                text[i] = jsonText[start];
            }
            else
            {
                text[i] = ' ';
            }
        }
        assert(i <= 71);
        text[i++] = '\n';
        text[i] = 0;
        {
            char * newStr = (char *)
                YA_MALLOC(&(hand->alloc), (unsigned int)(strlen((char *) str) +
                                                         strlen((char *) text) +
                                                         strlen(arrow) + 1));
            if (newStr) {
                newStr[0] = 0;
                strcat((char *) newStr, (char *) str);
                strcat((char *) newStr, text);
                strcat((char *) newStr, arrow);
            }
            YA_FREE(&(hand->alloc), str);
            str = (unsigned char *) newStr;
        }
    }
    return str;
}